

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zip_tests.cpp
# Opt level: O3

void __thiscall omp_zip_iterator_types_Test::TestBody(omp_zip_iterator_types_Test *this)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  vector<int,_std::allocator<int>_> initial1;
  vector<int,_std::allocator<int>_> initial2;
  allocator_type local_61;
  vector<int,_std::allocator<int>_> local_60;
  vector<int,_std::allocator<int>_> local_48;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined4 local_18;
  
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x200000001;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x400000003;
  local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 5;
  __l._M_len = 5;
  __l._M_array = (iterator)&local_48;
  std::vector<int,_std::allocator<int>_>::vector(&local_60,__l,(allocator_type *)&local_28);
  local_28 = 0x700000006;
  uStack_20 = 0x900000008;
  local_18 = 0;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&local_28;
  std::vector<int,_std::allocator<int>_>::vector(&local_48,__l_00,&local_61);
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(omp_zip, iterator_types) {
  const std::vector initial1 = {1, 2, 3, 4, 5};
  std::vector initial2 = {6, 7, 8, 9, 0};

  auto result = omp::zip_iterator(std::begin(initial1), std::begin(initial2));

  auto f_is_const_it = std::is_same_v<
      decltype(initial1)::const_iterator,
      std::tuple_element_t<0, std::decay_t<decltype(result.iterators())>>>;

  auto s_is_it = std::is_same_v<
      decltype(initial2)::iterator,
      std::tuple_element_t<1, std::decay_t<decltype(result.iterators())>>>;

  ASSERT_TRUE(f_is_const_it && s_is_it);
}